

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O0

CompiledFilter __thiscall Rml::FilterBasic::CompileFilter(FilterBasic *this,Element *element)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  RenderManager *name;
  Element *in_RDX;
  unsigned_long extraout_RDX;
  CompiledFilter CVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_108;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  local_cf;
  key_compare local_ce;
  undefined1 local_cd;
  Variant local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_90;
  iterator local_48;
  size_type local_40;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_38;
  Element *element_local;
  FilterBasic *this_local;
  
  element_local = element;
  this_local = this;
  name = Element::GetRenderManager(in_RDX);
  local_cd = 1;
  local_98 = &local_90;
  Variant::Variant<float_const&,void>
            (&local_c0,
             (float *)&(element->children).
                       super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(&local_90,(char (*) [6])0x70c2fa,&local_c0);
  local_cd = 0;
  local_48 = &local_90;
  local_40 = 1;
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  ::allocator(&local_cf);
  init._M_len = local_40;
  init._M_array = local_48;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_38,init,&local_ce,&local_cf);
  RenderManager::CompileFilter
            ((RenderManager *)this,(String *)name,
             (Dictionary *)&element->super_EnableObserverPtr<Rml::Element>);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&local_38);
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  ::~allocator(&local_cf);
  local_108 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
               *)&local_48;
  do {
    local_108 = local_108 + -1;
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::~pair(local_108);
  } while (local_108 != &local_90);
  Variant::~Variant(&local_c0);
  CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.resource_handle =
       extraout_RDX;
  CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)this;
  return (CompiledFilter)CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>;
}

Assistant:

CompiledFilter FilterBasic::CompileFilter(Element* element) const
{
	return element->GetRenderManager()->CompileFilter(name, Dictionary{{"value", Variant(value)}});
}